

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void apx_istream_write(apx_istream_t *self,uint8_t *chunk,uint32_t chunk_len)

{
  uint32_t uVar1;
  apx_error_t aVar2;
  uint8_t *puVar3;
  uint8_t *pEnd;
  long local_50;
  size_t eol_size;
  uint8_t *puStack_40;
  uint8_t first_byte;
  uint8_t *line_end;
  uint8_t *line_begin;
  uint8_t *buffer_end;
  uint8_t *buffer_begin;
  uint32_t chunk_len_local;
  uint8_t *chunk_local;
  apx_istream_t *self_local;
  
  if (((self != (apx_istream_t *)0x0) && (chunk != (uint8_t *)0x0)) && (chunk_len != 0)) {
    adt_bytearray_append(&self->buf,chunk,chunk_len);
    puVar3 = adt_bytearray_data(&self->buf);
    uVar1 = adt_bytearray_length(&self->buf);
    pEnd = puVar3 + uVar1;
    line_end = puVar3;
LAB_0014f370:
    do {
      if (pEnd <= line_end) {
LAB_0014f45a:
        if (line_end <= puVar3) {
          return;
        }
        if (line_end == pEnd) {
          adt_bytearray_clear(&self->buf);
          return;
        }
        if (line_end < pEnd) {
          adt_bytearray_trimLeft(&self->buf,line_end);
          return;
        }
        __assert_fail("line_begin < buffer_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/stream.c"
                      ,0xcb,"void apx_istream_write(apx_istream_t *, const uint8_t *, uint32_t)");
      }
      puStack_40 = bstr_search_val(line_end,pEnd,'\n');
      if (puStack_40 != line_end) {
        if (puStack_40 <= line_end) goto LAB_0014f45a;
        local_50 = 1;
        if (puStack_40[-1] == '\r') {
          puStack_40 = puStack_40 + -1;
          local_50 = 2;
        }
        aVar2 = apx_istream_handler_new_line(&self->handler,(char *)line_end,(char *)puStack_40);
        self->last_error = aVar2;
        if (self->last_error != 0) {
          return;
        }
        line_end = puStack_40 + local_50;
        goto LAB_0014f370;
      }
      if (*line_end != '\n') goto LAB_0014f45a;
      aVar2 = apx_istream_handler_new_line(&self->handler,(char *)line_end,(char *)puStack_40);
      self->last_error = aVar2;
      line_end = line_end + 1;
    } while (self->last_error == 0);
  }
  return;
}

Assistant:

void apx_istream_write(apx_istream_t* self, uint8_t const* chunk, uint32_t chunk_len)
{
   if ( (self != NULL) && (chunk != NULL) && (chunk_len != 0u) )
   {
      const uint8_t* buffer_begin;
      const uint8_t* buffer_end;
      const uint8_t* line_begin;
      adt_bytearray_append(&self->buf, chunk, chunk_len);
      buffer_begin = line_begin = adt_bytearray_data(&self->buf);
      buffer_end = buffer_begin + adt_bytearray_length(&self->buf);

      while (line_begin < buffer_end)
      {
         const uint8_t* line_end = bstr_search_val(line_begin, buffer_end, (uint8_t)'\n');
         if (line_end == line_begin)
         {
            const uint8_t first_byte = *line_begin;
            if (first_byte == '\n')
            {
               //empty line
               self->last_error = apx_istream_handler_new_line(&self->handler, (const char*) line_begin++, (const char*) line_end);
               if (self->last_error != APX_NO_ERROR)
               {
                  return;
               }
            }
            else
            {
               break; //Wait for next write (or possible close)
            }
         }
         else if (line_end > line_begin)
         {
            size_t eol_size = 1u;
            if (line_end[-1] == '\r')
            {
               line_end--;
               eol_size = 2;
            }
            self->last_error = apx_istream_handler_new_line(&self->handler, (const char*) line_begin, (const char*) line_end);
            if (self->last_error != APX_NO_ERROR)
            {
               return;
            }
            line_begin = line_end + eol_size; //skip past the new-line character(s)
         }
         else
         {
            break; //Wait for more data
         }
      }
      if ( (line_begin > buffer_begin) )
      {
         if (line_begin == buffer_end)
         {
            adt_bytearray_clear(&self->buf);
         }
         else
         {
            assert(line_begin < buffer_end);
            adt_bytearray_trimLeft(&self->buf, line_begin);
         }
      }
   }
}